

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

_Bool CrawlOperators(Lexer *lexer)

{
  int iVar1;
  byte bVar2;
  _Bool _Var3;
  ushort **ppuVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  byte bVar8;
  
  iVar7 = (lexer->tracker).currentTokenPosition;
  iVar1 = lexer->length;
  bVar8 = 0xff;
  bVar2 = 0xff;
  if (iVar7 < iVar1) {
    bVar2 = lexer->rawSourceCode[iVar7];
  }
  lVar6 = (long)iVar7 + 1;
  iVar5 = (int)lVar6;
  (lexer->tracker).currentTokenPosition = iVar5;
  if (iVar5 < iVar1) {
    bVar8 = lexer->rawSourceCode[lVar6];
  }
  (lexer->tracker).currentTokenPosition = iVar7;
  (lexer->tracker).tokenStart = iVar7;
  _Var3 = false;
  if (bVar2 < 0x5b) {
    _Var3 = false;
    switch(bVar2) {
    case 0x21:
    case 0x25:
    case 0x2a:
    case 0x2f:
    case 0x3d:
switchD_001042a3_caseD_21:
      if (bVar8 == 0x3d) goto LAB_001042af;
      break;
    default:
      goto switchD_001042a3_caseD_22;
    case 0x23:
    case 0x24:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x3a:
    case 0x3b:
    case 0x40:
      break;
    case 0x26:
      if ((bVar8 - 0x26 < 0x39) && ((0x100000000800001U >> ((ulong)(bVar8 - 0x26) & 0x3f) & 1) != 0)
         ) goto LAB_001042af;
      break;
    case 0x2b:
      if ((bVar8 == 0x3d) || (bVar8 == 0x2b)) goto LAB_001042af;
      break;
    case 0x2d:
      if ((bVar8 < 0x3f) && ((0x6000200000000000U >> ((ulong)bVar8 & 0x3f) & 1) != 0)) {
        (lexer->tracker).currentTokenPosition = iVar5;
      }
      ppuVar4 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar4 + (long)(char)bVar8 * 2 + 1) & 8) != 0) || (bVar8 == 0x2e)) {
LAB_00104394:
        CrawlNumbers(lexer);
      }
      break;
    case 0x2e:
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (long)(char)bVar8 * 2 + 1) & 8) != 0) goto LAB_00104394;
      break;
    case 0x3c:
      if (((bVar8 & 0xef) == 0x2d) || (bVar8 == 0x3c)) goto LAB_001042af;
      break;
    case 0x3e:
      if (bVar8 != 0x3e) {
LAB_001043c0:
        if (bVar8 != 0x3d) break;
      }
LAB_001042af:
      (lexer->tracker).currentTokenPosition = iVar5;
    }
  }
  else {
    if (bVar2 < 0x7b) {
      switch(bVar2) {
      case 0x5b:
      case 0x5d:
      case 0x60:
        goto switchD_001042a3_caseD_23;
      default:
        goto switchD_001042a3_caseD_22;
      case 0x5e:
        goto switchD_001042a3_caseD_21;
      }
    }
    if (bVar2 != 0x7b) {
      if (bVar2 == 0x7c) {
        if (bVar8 != 0x7c) goto LAB_001043c0;
        goto LAB_001042af;
      }
      if (bVar2 != 0x7d) goto switchD_001042a3_caseD_22;
    }
  }
switchD_001042a3_caseD_23:
  iVar7 = (lexer->tracker).currentTokenPosition + 1;
  (lexer->tracker).currentTokenPosition = iVar7;
  _Var3 = true;
switchD_001042a3_caseD_22:
  (lexer->tracker).tokenEnd = iVar7;
  return _Var3;
}

Assistant:

bool CrawlOperators(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	SetTokenStart(lexer);
	switch (currentChar){
		case '/': {
			if (nextChar == '/' || nextChar == '*') {} // TODO: Eat Comments
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '*': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '=': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '+': {
			if (nextChar == '+' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '-': {
			if (nextChar == '-' || nextChar == '=' || nextChar == '>') GetNextCharacter(lexer);
			if (isdigit(nextChar) || nextChar == '.') CrawlNumbers(lexer);
			break;
		}
		case '%': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '<': {
			if (nextChar == '-' || nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '<') GetNextCharacter(lexer); // TODO: Implement <<=
			break;
		}
		case '>': {
			if (nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '>') GetNextCharacter(lexer); // TODO: Implement >>=
			break;
		}
		case '!': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '&': {
			if (nextChar == '&' || nextChar == '^' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '|': {
			if (nextChar == '|' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '^': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '.': {
			if (isdigit(nextChar)) CrawlNumbers(lexer);
			break;
		}
		case '`':
		case '@':
		case '$':
		case ';':
		case ',':
		case '(':
		case ')':
		case '[':
		case ']':
		case '{':
		case '}':
		case '#':
		case ':': break;
		default: {
			SetTokenEnd(lexer);
			return false;
		}
	}
	GetNextCharacter(lexer);
	SetTokenEnd(lexer);
	return true;
}